

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpy.c
# Opt level: O0

int main(void)

{
  char *pcVar1;
  char local_12 [8];
  char s [6];
  
  stack0xfffffffffffffff4 = 0;
  local_12[0] = 'x';
  local_12[1] = 'x';
  local_12[2] = 'x';
  local_12[3] = 'x';
  local_12[4] = 'x';
  local_12[5] = '\0';
  pcVar1 = strcpy(local_12,"");
  if (pcVar1 != local_12) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy.c, line %d - %s\n"
           ,0x20,"strcpy( s, \"\" ) == s");
  }
  if (local_12[0] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy.c, line %d - %s\n"
           ,0x21,"s[0] == \'\\0\'");
  }
  if (local_12[1] != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy.c, line %d - %s\n"
           ,0x22,"s[1] == \'x\'");
  }
  pcVar1 = strcpy(local_12,"abcde");
  if (pcVar1 != local_12) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy.c, line %d - %s\n"
           ,0x23,"strcpy( s, abcde ) == s");
  }
  if (local_12[0] != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy.c, line %d - %s\n"
           ,0x24,"s[0] == \'a\'");
  }
  if (local_12[4] != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy.c, line %d - %s\n"
           ,0x25,"s[4] == \'e\'");
  }
  if (local_12[5] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcpy.c, line %d - %s\n"
           ,0x26,"s[5] == \'\\0\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "xxxxx";
    TESTCASE( strcpy( s, "" ) == s );
    TESTCASE( s[0] == '\0' );
    TESTCASE( s[1] == 'x' );
    TESTCASE( strcpy( s, abcde ) == s );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == '\0' );
    return TEST_RESULTS;
}